

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O2

void filter(double *sig,int len_sig,double *filt,int len_filt,double *oup)

{
  double *oup_00;
  ulong uVar1;
  ulong uVar2;
  
  oup_00 = (double *)malloc((long)(len_sig + len_filt + -1) << 3);
  conv_direct(sig,len_sig,filt,len_filt,oup_00);
  uVar1 = 0;
  uVar2 = (ulong)(uint)len_sig;
  if (len_sig < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    oup[uVar1] = oup_00[uVar1];
  }
  free(oup_00);
  return;
}

Assistant:

void filter(double *sig, int len_sig, double *filt, int len_filt, double *oup) {
	int N,i;
	double *temp;
	/*
	 *
	 * filter returns the output which is of same length as the input
	 * unlike conv function
	 *
	 */
	
	N = len_sig + len_filt - 1;
	temp = (double*) malloc (sizeof(double) * N);
	
	conv_direct(sig,len_sig, filt, len_filt,temp);
	
	for (i = 0; i < len_sig; ++i) {
		oup[i] = temp[i];
	}
	
	free(temp);
	
	
}